

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

UInt64 __thiscall Json::Value::asUInt64(Value *this)

{
  bool bVar1;
  ulong uVar2;
  runtime_error *prVar3;
  Value *this_local;
  
  switch(this->field_0x8) {
  case 0:
    this_local = (Value *)0x0;
    break;
  case 1:
    bVar1 = isUInt64(this);
    if (!bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"LargestInt out of UInt64 range");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local = (Value *)(this->value_).map_;
    break;
  case 2:
    this_local = (Value *)(this->value_).map_;
    break;
  case 3:
    bVar1 = InRange<int,unsigned_long_long>((this->value_).real_,0,0xffffffffffffffff);
    if (!bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"double out of UInt64 range");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar2 = (ulong)(this->value_).real_;
    this_local = (Value *)(uVar2 | (long)((this->value_).real_ - 9.223372036854776e+18) &
                                   (long)uVar2 >> 0x3f);
    break;
  default:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Value is not convertible to UInt64.");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    this_local = (Value *)(long)(int)(uint)(((this->value_).bool_ & 1U) != 0);
  }
  return (UInt64)this_local;
}

Assistant:

Value::UInt64
Value::asUInt64() const
{
   switch ( type_ )
   {
   case intValue:
      JSON_ASSERT_MESSAGE(isUInt64(), "LargestInt out of UInt64 range");
      return UInt64(value_.int_);
   case uintValue:
      return UInt64(value_.uint_);
   case realValue:
      JSON_ASSERT_MESSAGE(InRange(value_.real_, 0, maxUInt64), "double out of UInt64 range");
      return UInt64( value_.real_ );
   case nullValue:
      return 0;
   case booleanValue:
      return value_.bool_ ? 1 : 0;
   default:
      break;
   }
   JSON_FAIL_MESSAGE("Value is not convertible to UInt64.");
}